

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::_InternalParse(MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  bool bVar6;
  string *psVar7;
  char *field_name;
  uint32_t res;
  uint uVar8;
  int size;
  undefined8 *puVar9;
  byte *pbVar10;
  pointer data;
  byte *unaff_R12;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_int> pVar12;
  byte *local_40;
  ValueOnMemory *local_38;
  
  local_38 = &this->value_;
  local_40 = (byte *)ptr;
  do {
    bVar5 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    if (bVar5) {
      return (char *)local_40;
    }
    bVar1 = *local_40;
    auVar4[8] = bVar1;
    auVar4._0_8_ = local_40 + 1;
    auVar4._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_40[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar11 = ReadTagFallback((char *)local_40,res);
        auVar4 = pVar11._0_12_;
      }
      else {
        auVar4._8_4_ = res;
        auVar4._0_8_ = local_40 + 2;
      }
    }
    local_40 = auVar4._0_8_;
    if (local_40 == (byte *)0x0) {
      bVar5 = false;
      unaff_R12 = (byte *)0x0;
    }
    else {
      uVar8 = auVar4._8_4_;
      if (uVar8 == 0) {
LAB_0024e7ba:
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
        bVar5 = false;
        unaff_R12 = local_40;
      }
      else {
        if (uVar8 == 0x12) {
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar9 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            puVar9 = (undefined8 *)*puVar9;
          }
          psVar7 = ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar9);
          bVar1 = *local_40;
          uVar8 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            pVar12 = ReadSizeFallback((char *)local_40,(uint)bVar1);
            uVar8 = pVar12.second;
            pbVar10 = (byte *)pVar12.first;
          }
          else {
            pbVar10 = local_40 + 1;
          }
          if (pbVar10 == (byte *)0x0) {
            local_40 = (byte *)0x0;
          }
          else {
            local_40 = (byte *)EpsCopyInputStream::ReadString
                                         (&ctx->super_EpsCopyInputStream,(char *)pbVar10,uVar8,
                                          psVar7);
          }
          data = (psVar7->_M_dataplus)._M_p;
          size = (int)psVar7->_M_string_length;
          field_name = "CoreML.Specification.Metadata.UserDefinedEntry.value";
LAB_0024e851:
          bVar5 = false;
          bVar6 = WireFormatLite::VerifyUtf8String(data,size,PARSE,field_name);
          if (!bVar6) {
            unaff_R12 = (byte *)0x0;
            goto LAB_0024e878;
          }
        }
        else {
          if (uVar8 == 10) {
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar9 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              puVar9 = (undefined8 *)*puVar9;
            }
            psVar7 = ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar9);
            bVar1 = *local_40;
            uVar8 = (uint)bVar1;
            if ((char)bVar1 < '\0') {
              pVar12 = ReadSizeFallback((char *)local_40,(uint)bVar1);
              uVar8 = pVar12.second;
              pbVar10 = (byte *)pVar12.first;
            }
            else {
              pbVar10 = local_40 + 1;
            }
            if (pbVar10 == (byte *)0x0) {
              local_40 = (byte *)0x0;
            }
            else {
              local_40 = (byte *)EpsCopyInputStream::ReadString
                                           (&ctx->super_EpsCopyInputStream,(char *)pbVar10,uVar8,
                                            psVar7);
            }
            data = (psVar7->_M_dataplus)._M_p;
            size = (int)psVar7->_M_string_length;
            field_name = "CoreML.Specification.Metadata.UserDefinedEntry.key";
            goto LAB_0024e851;
          }
          if ((uVar8 & 7) == 4) goto LAB_0024e7ba;
          local_40 = (byte *)UnknownFieldParse(uVar8,(string *)0x0,(char *)local_40,ctx);
        }
        bVar5 = local_40 != (byte *)0x0;
        if (!bVar5) {
          unaff_R12 = (byte *)0x0;
        }
      }
    }
LAB_0024e878:
    if (!bVar5) {
      return (char *)unaff_R12;
    }
  } while( true );
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }